

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossiblePortConnection(TokenKind kind)

{
  bool bVar1;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  uVar2 = (uint)CONCAT62(in_register_0000003a,kind);
  if ((uVar2 < 0x1a) && ((0x3020000U >> (uVar2 & 0x1f) & 1) != 0)) {
    return true;
  }
  bVar1 = isPossibleArgument(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossiblePortConnection(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleArgument(kind);
    }
}